

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbank.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  InputOutputFormats input_format;
  double dVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ostream *poVar9;
  size_t sVar10;
  string *this;
  double *energy_00;
  char *__s;
  double dVar11;
  int fft_length;
  int num_channel;
  double highest_frequency;
  double lowest_frequency;
  double floor;
  double sampling_rate;
  ostringstream error_message_12;
  double energy;
  ifstream ifs;
  vector<double,_std::allocator<double>_> output;
  vector<double,_std::allocator<double>_> processed_input;
  vector<double,_std::allocator<double>_> input;
  MelFilterBankAnalysis analysis;
  WaveformToSpectrum waveform_to_spectrum;
  SpectrumToSpectrum spectrum_to_spectrum;
  Buffer buffer_for_spectral_analysis;
  int local_6cc;
  InputOutputFormats local_6c8;
  int local_6c4;
  string local_6c0;
  double local_6a0;
  ulong local_698;
  double local_690;
  ulong local_688;
  double local_680;
  double local_678;
  string local_670 [3];
  ios_base local_600 [264];
  double local_4f8;
  double local_4f0;
  string local_4e8;
  byte abStack_4c8 [80];
  ios_base local_478 [408];
  vector<double,_std::allocator<double>_> local_2e0;
  vector<double,_std::allocator<double>_> local_2c8;
  vector<double,_std::allocator<double>_> local_2b0;
  MelFilterBankAnalysis local_298;
  WaveformToSpectrum local_228;
  SpectrumToSpectrum local_138;
  Buffer local_f0;
  
  local_6c4 = 0x14;
  local_6cc = 0x100;
  local_678 = 16.0;
  local_690 = 0.0;
  local_688 = 0;
  local_6a0 = 0.0;
  local_680 = 1.0;
  local_6c8 = kNumInputOutputFormats;
  local_698 = 0;
  iVar7 = 0;
  do {
    paVar8 = &local_670[0].field_2;
    iVar6 = ya_getopt_long(argc,argv,"n:l:s:L:H:q:o:e:h",(option *)0x0,(int *)0x0);
    if (iVar6 < 0x65) {
      if (iVar6 != -1) {
        if (iVar6 == 0x48) {
          std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
          bVar3 = sptk::ConvertStringToDouble(&local_4e8,&local_6a0);
          bVar4 = local_6a0 <= 0.0;
          paVar8 = &local_4e8.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != paVar8) {
            operator_delete(local_4e8._M_dataplus._M_p);
            paVar8 = extraout_RAX;
          }
          if (!bVar3 || bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_4e8,
                       "The argument for the -H option must be a positive number",0x38);
            local_670[0]._M_dataplus._M_p = (pointer)&local_670[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
            sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
            goto LAB_00103fb6;
          }
          local_698 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
        }
        else {
          if (iVar6 != 0x4c) goto switchD_001038e1_caseD_66;
          std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
          bVar3 = sptk::ConvertStringToDouble(&local_4e8,&local_690);
          bVar4 = local_690 < 0.0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p);
          }
          if (!bVar3 || bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_4e8,"The argument for the -L option must be a ",0x29);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_4e8,"non-negative number",0x13);
            local_670[0]._M_dataplus._M_p = (pointer)&local_670[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
            sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
            goto LAB_00103fb6;
          }
        }
        goto LAB_00103f63;
      }
      iVar6 = 2;
      goto LAB_00103fec;
    }
    switch(iVar6) {
    case 0x65:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar3 = sptk::ConvertStringToDouble(&local_4e8,&local_680);
      bVar4 = local_680 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"The argument for the -e option must be a positive number",
                   0x38);
        local_670[0]._M_dataplus._M_p = (pointer)&local_670[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
LAB_00103fb6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670[0]._M_dataplus._M_p != &local_670[0].field_2) {
          operator_delete(local_670[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4e8);
        std::ios_base::~ios_base(local_478);
        goto LAB_00103fe1;
      }
      break;
    default:
switchD_001038e1_caseD_66:
      anon_unknown.dwarf_2cc3::PrintUsage((ostream *)&std::cerr);
LAB_00103fe1:
      iVar6 = 1;
      iVar7 = 1;
      goto LAB_00103fec;
    case 0x68:
      anon_unknown.dwarf_2cc3::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar6 = 1;
      goto LAB_00103fec;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar4 = sptk::ConvertStringToInteger(&local_4e8,&local_6cc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"The argument for the -l option must be an integer",0x31);
        local_670[0]._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
        goto LAB_00103fb6;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar3 = sptk::ConvertStringToInteger(&local_4e8,&local_6c4);
      bVar4 = local_6c4 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"The argument for the -n option must be a positive integer"
                   ,0x39);
        local_670[0]._M_dataplus._M_p = (pointer)&local_670[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
        goto LAB_00103fb6;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar4 = sptk::ConvertStringToInteger(&local_4e8,(int *)&local_228);
      if (!bVar4) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p);
        }
LAB_00103e9a:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"in the range of ",0x10);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_4e8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
        std::ostream::operator<<((ostream *)poVar9,1);
        local_670[0]._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
        goto LAB_00103f23;
      }
      bVar4 = sptk::IsInRange((InputOutputFormats)local_228._vptr_WaveformToSpectrum,0,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_00103e9a;
      iVar6 = 4;
      bVar4 = true;
      local_688 = (ulong)local_228._vptr_WaveformToSpectrum & 0xffffffff;
      goto LAB_00103f5b;
    case 0x71:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar4 = sptk::ConvertStringToInteger(&local_4e8,(int *)&local_228);
      if (bVar4) {
        bVar4 = sptk::IsInRange((InputOutputFormats)local_228._vptr_WaveformToSpectrum,0,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p);
        }
        if (bVar4) {
          iVar6 = 4;
          bVar4 = true;
          local_6c8 = (InputOutputFormats)local_228._vptr_WaveformToSpectrum;
          goto LAB_00103f5b;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4e8,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4e8,"in the range of ",0x10);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_4e8,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
      std::ostream::operator<<((ostream *)poVar9,4);
      local_670[0]._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
      sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
LAB_00103f23:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670[0]._M_dataplus._M_p != paVar8) {
        operator_delete(local_670[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4e8);
      std::ios_base::~ios_base(local_478);
      iVar6 = 1;
      bVar4 = false;
      iVar7 = 1;
LAB_00103f5b:
      if (bVar4) break;
      goto LAB_00103fec;
    case 0x73:
      std::__cxx11::string::string((string *)&local_4e8,ya_optarg,(allocator *)local_670);
      bVar3 = sptk::ConvertStringToDouble(&local_4e8,&local_678);
      bVar4 = local_678 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"The argument for the -s option must be a positive number",
                   0x38);
        local_670[0]._M_dataplus._M_p = (pointer)&local_670[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
        goto LAB_00103fb6;
      }
    }
LAB_00103f63:
    iVar6 = 0;
LAB_00103fec:
    input_format = local_6c8;
    paVar8 = &local_670[0].field_2;
  } while (iVar6 == 0);
  if (iVar6 == 2) {
    dVar11 = local_678 * 1000.0 * 0.5;
    dVar2 = dVar11;
    if (((local_698 & 1) == 0) || (dVar2 = local_6a0, local_6a0 <= dVar11)) {
      local_6a0 = dVar2;
      if (local_6a0 <= local_690) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"Lowest frequency must be less than highest one",0x2e);
        local_670[0]._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
      }
      else if (argc - ya_optind < 2) {
        if (argc == ya_optind) {
          __s = (char *)0x0;
        }
        else {
          __s = argv[ya_optind];
        }
        local_4f8 = local_678 * 1000.0;
        bVar4 = sptk::SetBinaryMode();
        this = &local_4e8;
        if (bVar4) {
          std::ifstream::ifstream(this);
          if ((__s == (char *)0x0) ||
             (std::ifstream::open((char *)&local_4e8,(_Ios_Openmode)__s),
             (abStack_4c8[*(long *)(local_4e8._M_dataplus._M_p + -0x18)] & 5) == 0)) {
            cVar5 = std::__basic_file<char>::is_open();
            if (cVar5 == '\0') {
              this = (string *)&std::cin;
            }
            sptk::SpectrumToSpectrum::SpectrumToSpectrum
                      (&local_138,local_6cc,input_format,kPowerSpectrum,0.0,-1.79769313486232e+308);
            if ((input_format == kNumInputOutputFormats) || (local_138.is_valid_ != false)) {
              sptk::WaveformToSpectrum::WaveformToSpectrum
                        (&local_228,local_6cc,local_6cc,kPowerSpectrum,0.0,-1.79769313486232e+308);
              local_f0._vptr_Buffer = (_func_int **)&PTR__Buffer_00115778;
              local_f0.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_001157a8;
              local_f0.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_001157d8;
              memset(&local_f0.buffer_.fast_fourier_transform_buffer_.real_part_input_,0,0xa8);
              if ((input_format == kNumInputOutputFormats) &&
                 (local_228.filter_coefficients_to_spectrum_.is_valid_ == false)) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_670,"Failed to set condition for spectral analysis",0x2d
                          );
                local_298._vptr_MelFilterBankAnalysis = (_func_int **)&local_298.floor_;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"fbank","");
                sptk::PrintErrorMessage((string *)&local_298,(ostringstream *)local_670);
                if (local_298._vptr_MelFilterBankAnalysis != (_func_int **)&local_298.floor_) {
                  operator_delete(local_298._vptr_MelFilterBankAnalysis);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
                std::ios_base::~ios_base(local_600);
                iVar7 = 1;
              }
              else {
                sptk::MelFilterBankAnalysis::MelFilterBankAnalysis
                          (&local_298,local_6cc,local_6c4,local_4f8,local_690,local_6a0,local_680,
                           false);
                if (local_298.is_valid_ == false) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_670,"Failed to set condition for filter-bank analysis"
                             ,0x30);
                  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"fbank","");
                  sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
                    operator_delete(local_6c0._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
                  std::ios_base::~ios_base(local_600);
                  iVar7 = 1;
                }
                else {
                  iVar7 = local_6cc;
                  if (input_format != kNumInputOutputFormats) {
                    iVar7 = local_6cc / 2 + 1;
                  }
                  local_698 = (ulong)local_6c4;
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_2b0,(long)iVar7,(allocator_type *)local_670);
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_2c8,(long)(local_6cc / 2 + 1),(allocator_type *)local_670);
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_2e0,local_698,(allocator_type *)local_670);
                  energy_00 = &local_4f0;
                  if ((int)local_688 != 1) {
                    energy_00 = (double *)0x0;
                  }
                  do {
                    bVar4 = sptk::ReadStream<double>
                                      (false,0,0,iVar7,&local_2b0,(istream *)this,(int *)0x0);
                    if (!bVar4) {
                      iVar7 = 0;
                      goto LAB_00104912;
                    }
                    if (local_6c8 == kNumInputOutputFormats) {
                      bVar4 = sptk::WaveformToSpectrum::Run
                                        (&local_228,&local_2b0,&local_2c8,&local_f0);
                      if (!bVar4) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_670,"Failed to transform waveform to spectrum",
                                   0x28);
                        local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_6c0,"fbank","");
                        sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
                        goto LAB_001048df;
                      }
                    }
                    else {
                      bVar4 = sptk::SpectrumToSpectrum::Run(&local_138,&local_2b0,&local_2c8);
                      if (!bVar4) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_670,"Failed to convert spectrum",0x1a);
                        local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_6c0,"fbank","");
                        sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
                        goto LAB_001048df;
                      }
                    }
                    bVar4 = sptk::MelFilterBankAnalysis::Run
                                      (&local_298,&local_2c8,&local_2e0,energy_00);
                    if (!bVar4) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_670,"Failed to run mel-filter bank analysis",0x26)
                      ;
                      local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_6c0,"fbank","");
                      sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
                      goto LAB_001048df;
                    }
                    bVar4 = sptk::WriteStream<double>
                                      (0,(int)local_698,&local_2e0,(ostream *)&std::cout,(int *)0x0)
                    ;
                    if (!bVar4) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_670,"Failed to write filter-bank output",0x22);
                      local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_6c0,"fbank","");
                      sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
                      goto LAB_001048df;
                    }
                  } while (((int)local_688 != 1) ||
                          (bVar4 = sptk::WriteStream<double>(local_4f0,(ostream *)&std::cout), bVar4
                          ));
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_670,"Failed to write energy",0x16);
                  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"fbank","");
                  sptk::PrintErrorMessage(&local_6c0,(ostringstream *)local_670);
LAB_001048df:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
                    operator_delete(local_6c0._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
                  std::ios_base::~ios_base(local_600);
                  iVar7 = 1;
LAB_00104912:
                  if (local_2e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2e0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2c8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2b0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                sptk::MelFilterBankAnalysis::~MelFilterBankAnalysis(&local_298);
              }
              local_f0._vptr_Buffer = (_func_int **)&PTR__Buffer_00115778;
              sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(&local_f0.buffer_);
              sptk::WaveformToSpectrum::~WaveformToSpectrum(&local_228);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_670,"Failed to set condition for input formatting",0x2c);
              piVar1 = &local_228.filter_coefficients_to_spectrum_.num_numerator_order_;
              local_228._vptr_WaveformToSpectrum = (_func_int **)piVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"fbank","");
              sptk::PrintErrorMessage((string *)&local_228,(ostringstream *)local_670);
              if (local_228._vptr_WaveformToSpectrum != (_func_int **)piVar1) {
                operator_delete(local_228._vptr_WaveformToSpectrum);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
              std::ios_base::~ios_base(local_600);
              iVar7 = 1;
            }
            sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&local_138);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_670,"Cannot open file ",0x11);
            sVar10 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,__s,sVar10);
            piVar1 = &local_228.filter_coefficients_to_spectrum_.num_numerator_order_;
            local_228._vptr_WaveformToSpectrum = (_func_int **)piVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"fbank","");
            sptk::PrintErrorMessage((string *)&local_228,(ostringstream *)local_670);
            if (local_228._vptr_WaveformToSpectrum != (_func_int **)piVar1) {
              operator_delete(local_228._vptr_WaveformToSpectrum);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
            std::ios_base::~ios_base(local_600);
            iVar7 = 1;
          }
          std::ifstream::~ifstream(&local_4e8);
          return iVar7;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_670[0]._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4e8,"Too many input files",0x14);
        local_670[0]._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
        sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4e8,
                 "Highest frequency must be less than or equal to Nyquist frequency",0x41);
      local_670[0]._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"fbank","");
      sptk::PrintErrorMessage(local_670,(ostringstream *)&local_4e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670[0]._M_dataplus._M_p != paVar8) {
      operator_delete(local_670[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4e8);
    std::ios_base::~ios_base(local_478);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_channel(kDefaultNumChannel);
  int fft_length(kDefaultFftLength);
  double sampling_rate(kDefaultSamplingRate);
  double lowest_frequency(kDefaultLowestFrequency);
  double highest_frequency(0.0);
  bool is_highest_frequency_specified(false);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  double floor(kDefaultFloor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "n:l:s:L:H:q:o:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_channel) ||
            num_channel <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lowest_frequency) ||
            lowest_frequency < 0.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a "
                        << "non-negative number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &highest_frequency) ||
            highest_frequency <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        is_highest_frequency_specified = true;
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &floor) || floor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("fbank", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (!is_highest_frequency_specified) {
    highest_frequency = 0.5 * sampling_rate_in_hz;
  } else if (0.5 * sampling_rate_in_hz < highest_frequency) {
    std::ostringstream error_message;
    error_message
        << "Highest frequency must be less than or equal to Nyquist frequency";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  if (highest_frequency <= lowest_frequency) {
    std::ostringstream error_message;
    error_message << "Lowest frequency must be less than highest one";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  sptk::MelFilterBankAnalysis analysis(fft_length, num_channel,
                                       sampling_rate_in_hz, lowest_frequency,
                                       highest_frequency, floor, false);
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for filter-bank analysis";
    sptk::PrintErrorMessage("fbank", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_channel);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double energy;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform != input_format) {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    } else {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      kFbankAndEnergy == output_format ? &energy : NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-filter bank analysis";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write filter-bank output";
      sptk::PrintErrorMessage("fbank", error_message);
      return 1;
    }

    if (kFbankAndEnergy == output_format) {
      if (!sptk::WriteStream(energy, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write energy";
        sptk::PrintErrorMessage("fbank", error_message);
        return 1;
      }
    }
  }

  return 0;
}